

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KModule.c
# Opt level: O0

cs_err M68K_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  m68k_info *info;
  cs_err local_4;
  
  pvVar1 = (*cs_mem_malloc)(0x180);
  if (pvVar1 != (void *)0x0) {
    *(code **)(in_RDI + 8) = M68K_printInst;
    *(void **)(in_RDI + 0x10) = pvVar1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
    *(code **)(in_RDI + 0x18) = M68K_getInstruction;
    *(undefined1 *)(in_RDI + 0x81) = 2;
    *(undefined8 *)(in_RDI + 0x48) = 0;
    *(code **)(in_RDI + 0x28) = M68K_reg_name;
    *(code **)(in_RDI + 0x40) = M68K_get_insn_id;
    *(code **)(in_RDI + 0x30) = M68K_insn_name;
    *(code **)(in_RDI + 0x38) = M68K_group_name;
  }
  local_4 = (cs_err)(pvVar1 == (void *)0x0);
  return local_4;
}

Assistant:

cs_err M68K_global_init(cs_struct *ud)
{
	m68k_info *info;

	info = cs_mem_malloc(sizeof(m68k_info));
	if (!info) {
		return CS_ERR_MEM;
	}

	ud->printer = M68K_printInst;
	ud->printer_info = info;
	ud->getinsn_info = NULL;
	ud->disasm = M68K_getInstruction;
	ud->skipdata_size = 2;
	ud->post_printer = NULL;

	ud->reg_name = M68K_reg_name;
	ud->insn_id = M68K_get_insn_id;
	ud->insn_name = M68K_insn_name;
	ud->group_name = M68K_group_name;

	return CS_ERR_OK;
}